

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

void toktheach(toktdef *tab1,_func_void_void_ptr_toksdef_ptr *cb,void *ctx)

{
  undefined4 uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  errdef fr_;
  uint i;
  uint siz;
  toksdef *sym;
  tokshdef *symh;
  uint ofs;
  uint max;
  uchar *p;
  tokthdef *tab;
  undefined4 in_stack_fffffffffffffe78;
  undefined2 in_stack_fffffffffffffe7c;
  mcmon in_stack_fffffffffffffe7e;
  errcxdef *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  __jmp_buf_tag _Stack_110;
  uint local_48;
  uint local_44;
  uchar *local_40;
  uchar *local_38;
  uint local_30;
  uint local_2c;
  uchar *local_28;
  long local_20;
  undefined8 local_18;
  code *local_10;
  long local_8;
  
  local_48 = 0;
  local_20 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (*(uint *)(local_20 + 0x838) < local_48) {
      return;
    }
    local_28 = mcmlck((mcmcxdef *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (mcmon)((ulong)in_stack_fffffffffffffe80 >> 0x30));
    iVar2 = _setjmp(&_Stack_110);
    if (iVar2 != 0) break;
    in_stack_fffffffffffffe80 = (errcxdef *)**(undefined8 **)(local_8 + 0x28);
    **(long **)(local_8 + 0x28) = (long)&stack0xfffffffffffffe80;
    if (local_48 == *(uint *)(local_20 + 0x838)) {
      in_stack_fffffffffffffe7c = *(undefined2 *)(local_20 + 0xb4a);
      in_stack_fffffffffffffe7e = 0;
    }
    else {
      uVar1 = *(undefined4 *)(local_20 + 0x93c + (ulong)local_48 * 4);
      in_stack_fffffffffffffe7c = (undefined2)uVar1;
      in_stack_fffffffffffffe7e = (mcmon)((uint)uVar1 >> 0x10);
    }
    local_2c = CONCAT22(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe7c);
    in_stack_fffffffffffffe88 = 0;
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + (int)sVar3) {
      local_38 = local_28 + local_30;
      local_40 = local_38 + 8;
      (*local_10)(local_18,local_40);
      local_44 = local_40[6] + 0x10;
      sVar3 = osrndsz((ulong)local_44);
    }
    **(undefined8 **)(local_8 + 0x28) = in_stack_fffffffffffffe80;
    mcmunlck((mcmcxdef *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7e);
    local_48 = local_48 + 1;
  }
  **(undefined8 **)(local_8 + 0x28) = in_stack_fffffffffffffe80;
  mcmunlck((mcmcxdef *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7e);
  errrse1(in_stack_fffffffffffffe80,
          (errdef *)
          CONCAT26(in_stack_fffffffffffffe7e,
                   CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)));
}

Assistant:

void toktheach(toktdef *tab1,
               void (*cb)(void *, toksdef *), void *ctx)
{
    tokthdef *tab = (tokthdef *)tab1;
    uchar    *p;
    uint      max;
    uint      ofs;
    tokshdef *symh;
    toksdef  *sym;
    uint      siz;
    uint      i;
    
    for (i = 0 ; i <= tab->tokthpcnt ; ++i)
    {
        /* lock the current page */
        p = mcmlck(tab->tokthmem, tab->tokthpool[i]);
        
        ERRBEGIN(tab1->tokterr)

        max = (i == tab->tokthpcnt ? tab->tokthofs : tab->tokthfinal[i]);
        for (ofs = 0 ; ofs < max ; )
        {
            /* get this symbol */
            symh = (tokshdef *)(p + ofs);
            sym = &symh->tokshsc;
            
            /* call the user callback */
            (*cb)(ctx, sym);
            
            /* advance to the next symbol on this page */
            siz = sizeof(toksh1def) + sym->tokslen;
            ofs += osrndsz(siz);
        }
            
        ERRCLEAN(tab1->tokterr)
            mcmunlck(tab->tokthmem, tab->tokthpool[i]);
        ERRENDCLN(tab1->tokterr)
            
        /* done with current page; unlock it */
        mcmunlck(tab->tokthmem, tab->tokthpool[i]);
    }
}